

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_resume_data.cpp
# Opt level: O0

entry * libtorrent::write_torrent_file
                  (entry *__return_storage_ptr__,add_torrent_params *atp,write_torrent_flags_t flags
                  )

{
  integer_type i;
  bool bVar1;
  int iVar2;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> rhs;
  int blocks_per_piece;
  element_type *peVar3;
  entry *peVar4;
  vector<char,std::allocator<char>> *this;
  char *pcVar5;
  char *pcVar6;
  index_type iVar7;
  ulong uVar8;
  size_type sVar9;
  dictionary_type *this_00;
  int64_t iVar10;
  value_type *pvVar11;
  mapped_type *this_01;
  string_type *psVar12;
  list_type *plVar13;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *this_02;
  reference pvVar14;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *pvVar15;
  const_reference pvVar16;
  span<const_char> sVar17;
  byte local_771;
  byte local_749;
  bool local_719;
  byte local_6e9;
  byte local_6bf;
  byte local_6be;
  byte local_686;
  value_type *local_670;
  string_view local_5a0;
  entry local_590;
  string_view local_568;
  string_type local_558;
  reference local_538;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *n_2;
  iterator __end2_3;
  iterator __begin2_3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2_3;
  string_view local_4e8;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *local_4d8;
  list_type *l_1;
  bdecode_node local_4c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_488;
  string local_470;
  reference local_450;
  digest32<160L> *n_1;
  iterator __end2_2;
  iterator __begin2_2;
  vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *__range2_2;
  string_view local_400;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *local_3f0;
  list_type *l;
  bdecode_node local_3e0;
  vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> local_3a0;
  string_type local_388;
  allocator<libtorrent::entry> local_361;
  undefined1 local_360 [8];
  list_type node;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int> *n;
  const_iterator __end2_1;
  const_iterator __begin2_1;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *__range2_1;
  vector<libtorrent::entry,std::allocator<libtorrent::entry>> *local_318;
  list_type *nodes;
  uint local_308;
  uint local_304;
  vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *local_300;
  vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *local_2f8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2f0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2e8;
  string_view local_2e0;
  list_type *local_2d0;
  list_type *httpseeds_list;
  uint local_2c0;
  uint local_2bc;
  vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *local_2b8;
  vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *local_2b0;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2a8;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_2a0;
  string_view local_298;
  list_type *local_288;
  list_type *url_list;
  uint local_278;
  error_code_enum local_274 [2];
  uint local_26c;
  uint local_268;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_264;
  string local_260;
  reference local_240;
  digest32<256L> *h;
  const_iterator __end3;
  const_iterator __begin3;
  vector<sha256_hash> *__range3;
  string local_200;
  string_type *local_1e0;
  string_type *layer;
  undefined1 local_1d0 [8];
  vector<sha256_hash> piece_layer;
  span<const_libtorrent::digest32<256L>_> local_1a0;
  int local_18c;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_188;
  int local_184;
  value_type *local_180;
  value_type *tree;
  value_type *local_170;
  bitfield *verified;
  undefined1 local_160 [8];
  merkle_tree t;
  file_index_t local_124;
  strong_typedef<int,_libtorrent::aux::file_index_tag,_void> local_120;
  file_index_t f;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> local_114
  ;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __end2;
  index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_> __begin2;
  index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
  *__range2;
  bitfield empty_verified;
  dictionary_type *piece_layers;
  vector<std::vector<sha256_hash>,_file_index_t> *local_d8;
  vector<std::vector<sha256_hash>,_file_index_t> *trees;
  file_storage *fs;
  string_type local_b8;
  string_view local_98;
  string_view local_88;
  string_type local_78;
  string_view local_58;
  undefined1 local_48 [8];
  span<const_char> info;
  error_code_enum local_28;
  undefined1 local_21;
  add_torrent_params *local_20;
  add_torrent_params *atp_local;
  entry *peStack_10;
  write_torrent_flags_t flags_local;
  entry *ret;
  
  local_21 = 0;
  local_20 = atp;
  atp_local._4_4_ = flags.m_val;
  peStack_10 = __return_storage_ptr__;
  entry::entry(__return_storage_ptr__);
  bVar1 = ::std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&local_20->ti);
  if (!bVar1) {
    local_28 = torrent_missing_info;
    aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>(&local_28);
  }
  peVar3 = ::std::
           __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_20->ti);
  sVar17 = torrent_info::info_section(peVar3);
  info.m_ptr = (char *)sVar17.m_len;
  local_48 = (undefined1  [8])sVar17.m_ptr;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_58,"info");
  peVar4 = entry::operator[](__return_storage_ptr__,local_58);
  this = (vector<char,std::allocator<char>> *)entry::preformatted(peVar4);
  pcVar5 = span<const_char>::data((span<const_char> *)local_48);
  pcVar6 = span<const_char>::data((span<const_char> *)local_48);
  iVar7 = span<const_char>::size((span<const_char> *)local_48);
  ::std::vector<char,std::allocator<char>>::assign<char_const*,void>(this,pcVar5,pcVar6 + iVar7);
  uVar8 = ::std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    ::std::__cxx11::string::string((string *)&local_78,(string *)&local_20->comment);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_88,"comment");
    peVar4 = entry::operator[](__return_storage_ptr__,local_88);
    entry::operator=(peVar4,&local_78);
    ::std::__cxx11::string::~string((string *)&local_78);
  }
  if (local_20->creation_date != 0) {
    i = local_20->creation_date;
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_98,"creation date");
    peVar4 = entry::operator[](__return_storage_ptr__,local_98);
    entry::operator=(peVar4,i);
  }
  uVar8 = ::std::__cxx11::string::empty();
  if ((uVar8 & 1) == 0) {
    ::std::__cxx11::string::string((string *)&local_b8,(string *)&local_20->created_by);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&fs,"created by");
    peVar4 = entry::operator[](__return_storage_ptr__,_fs);
    entry::operator=(peVar4,&local_b8);
    ::std::__cxx11::string::~string((string *)&local_b8);
  }
  bVar1 = ::std::
          vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
          ::empty(&(local_20->merkle_trees).
                   super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                 );
  if (bVar1) {
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_20->ti);
    bVar1 = torrent_info::v2(peVar3);
    local_6be = 0;
    if (bVar1) {
      local_26c = atp_local._4_4_;
      local_274[1] = 1;
      local_268 = (uint)libtorrent::flags::operator&
                                  (atp_local._4_4_,
                                   (bitfield_flag<unsigned_int,_libtorrent::write_torrent_flags_tag,_void>
                                    )0x1);
      bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_268);
      local_6be = bVar1 ^ 0xff;
    }
    if ((local_6be & 1) != 0) {
      local_274[0] = torrent_missing_piece_layer;
      aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>(local_274);
    }
  }
  else {
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_20->ti);
    trees = (vector<std::vector<sha256_hash>,_file_index_t> *)torrent_info::files(peVar3);
    local_d8 = &local_20->merkle_trees;
    sVar9 = ::std::
            vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
            ::size(&local_d8->
                    super_vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>
                  );
    iVar2 = file_storage::num_files((file_storage *)trees);
    if ((int)sVar9 != iVar2) {
      piece_layers._4_4_ = 0xd6;
      aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
                ((error_code_enum *)((long)&piece_layers + 4));
    }
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&empty_verified,"piece layers");
    peVar4 = entry::operator[](__return_storage_ptr__,_empty_verified);
    this_00 = entry::dict_abi_cxx11_(peVar4);
    bitfield::bitfield((bitfield *)&__range2);
    ___end2 = file_storage::file_range((file_storage *)trees);
    local_114 = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                ::begin((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                         *)&__end2);
    rhs = index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
          ::end((index_range<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                 *)&__end2);
    while( true ) {
      f.m_val = (int)local_114.m_idx.m_val;
      local_120 = rhs.m_idx.m_val;
      bVar1 = operator!=(local_114,rhs);
      if (!bVar1) break;
      local_124.m_val =
           (int)index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                ::operator*(&local_114);
      bVar1 = file_storage::pad_file_at((file_storage *)trees,local_124);
      if (!bVar1) {
        t.m_blocks_per_piece_log = (undefined1)local_124.m_val;
        t.m_mode = local_124.m_val._1_1_;
        t._46_2_ = local_124.m_val._2_2_;
        iVar10 = file_storage::file_size((file_storage *)trees,local_124);
        iVar2 = file_storage::piece_length((file_storage *)trees);
        if (iVar2 < iVar10) {
          verified._4_4_ = local_124.m_val;
          iVar2 = file_storage::file_num_blocks((file_storage *)trees,local_124);
          blocks_per_piece = file_storage::blocks_per_piece((file_storage *)trees);
          verified._0_4_ = local_124.m_val;
          pcVar5 = file_storage::root_ptr((file_storage *)trees,local_124);
          aux::merkle_tree::merkle_tree((merkle_tree *)local_160,iVar2,blocks_per_piece,pcVar5);
          tree._4_4_ = aux::
                       container_wrapper<libtorrent::bitfield,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>_>
                       ::end_index(&local_20->verified_leaf_hashes);
          bVar1 = aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator>=
                            (&local_124,
                             (strong_typedef<int,_libtorrent::aux::file_index_tag,_void> *)
                             ((long)&tree + 4));
          if (bVar1) {
            local_670 = (value_type *)&__range2;
          }
          else {
            tree._0_4_ = local_124.m_val;
            local_670 = aux::
                        container_wrapper<libtorrent::bitfield,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>_>
                        ::operator[](&local_20->verified_leaf_hashes,
                                     (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)
                                     local_124.m_val);
          }
          local_170 = local_670;
          local_184 = local_124.m_val;
          local_180 = aux::
                      container_wrapper<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>,_std::allocator<std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>_>_>
                      ::operator[](local_d8,(strong_typedef<int,_libtorrent::aux::file_index_tag,_void>
                                             )local_124.m_val);
          local_188 = aux::
                      container_wrapper<libtorrent::bitfield,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>_>
                      ::end_index(&local_20->merkle_tree_mask);
          bVar1 = aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>::operator<
                            (&local_124,&local_188);
          local_686 = 0;
          if (bVar1) {
            local_18c = local_124.m_val;
            pvVar11 = aux::
                      container_wrapper<libtorrent::bitfield,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>_>
                      ::operator[](&local_20->merkle_tree_mask,
                                   (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)
                                   local_124.m_val);
            bVar1 = bitfield::empty(pvVar11);
            local_686 = bVar1 ^ 0xff;
          }
          if ((local_686 & 1) == 0) {
            span<libtorrent::digest32<256l>const>::
            span<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,libtorrent::digest32<256l>,void>
                      ((span<libtorrent::digest32<256l>const> *)
                       &piece_layer.
                        super_vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                        .
                        super__Vector_base<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,local_180);
            aux::merkle_tree::load_tree((merkle_tree *)local_160,stack0xfffffffffffffe48,local_170);
          }
          else {
            span<libtorrent::digest32<256l>const>::
            span<std::vector<libtorrent::digest32<256l>,std::allocator<libtorrent::digest32<256l>>>,libtorrent::digest32<256l>,void>
                      ((span<libtorrent::digest32<256l>const> *)&local_1a0,local_180);
            pvVar11 = aux::
                      container_wrapper<libtorrent::bitfield,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>,_std::vector<libtorrent::bitfield,_std::allocator<libtorrent::bitfield>_>_>
                      ::operator[](&local_20->merkle_tree_mask,
                                   (strong_typedef<int,_libtorrent::aux::file_index_tag,_void>)
                                   local_124.m_val);
            aux::merkle_tree::load_sparse_tree((merkle_tree *)local_160,local_1a0,pvVar11,local_170)
            ;
          }
          aux::merkle_tree::get_piece_layer
                    ((vector<sha256_hash> *)local_1d0,(merkle_tree *)local_160);
          sVar9 = ::std::
                  vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::
                  size((vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                        *)local_1d0);
          layer._4_4_ = local_124.m_val;
          iVar2 = file_storage::file_num_pieces((file_storage *)trees,local_124);
          if ((int)sVar9 != iVar2) {
            layer._0_4_ = 0xd7;
            aux::throw_ex<boost::system::system_error,libtorrent::errors::error_code_enum>
                      ((error_code_enum *)&layer);
          }
          aux::merkle_tree::root((sha256_hash *)&__range3,(merkle_tree *)local_160);
          digest32<256l>::to_string_abi_cxx11_(&local_200,&__range3);
          this_01 = boost::container::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>
                    ::operator[](this_00,&local_200);
          psVar12 = entry::string_abi_cxx11_(this_01);
          ::std::__cxx11::string::~string((string *)&local_200);
          local_1e0 = psVar12;
          __end3 = ::std::
                   vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                   ::begin((vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                            *)local_1d0);
          h = (digest32<256L> *)
              ::std::
              vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>::end
                        ((vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>
                          *)local_1d0);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end3,(__normal_iterator<const_libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                                             *)&h), bVar1) {
            local_240 = __gnu_cxx::
                        __normal_iterator<const_libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                        ::operator*(&__end3);
            digest32<256l>::to_string_abi_cxx11_(&local_260,local_240);
            ::std::__cxx11::string::operator+=((string *)local_1e0,(string *)&local_260);
            ::std::__cxx11::string::~string((string *)&local_260);
            __gnu_cxx::
            __normal_iterator<const_libtorrent::digest32<256L>_*,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
            ::operator++(&__end3);
          }
          aux::
          container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
          ::~container_wrapper
                    ((container_wrapper<libtorrent::digest32<256L>,_int,_std::vector<libtorrent::digest32<256L>,_std::allocator<libtorrent::digest32<256L>_>_>_>
                      *)local_1d0);
          aux::merkle_tree::~merkle_tree((merkle_tree *)local_160);
        }
      }
      local_264.m_val =
           (int)index_iter<libtorrent::aux::strong_typedef<int,_libtorrent::aux::file_index_tag,_void>_>
                ::operator++(&local_114);
    }
    bitfield::~bitfield((bitfield *)&__range2);
  }
  bVar1 = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&local_20->url_seeds);
  local_6bf = 0;
  if (!bVar1) {
    url_list._4_4_ = atp_local._4_4_;
    url_list._0_4_ = 2;
    local_278 = (uint)libtorrent::flags::operator&
                                (atp_local._4_4_,
                                 (bitfield_flag<unsigned_int,_libtorrent::write_torrent_flags_tag,_void>
                                  )0x2);
    bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_278);
    local_6bf = bVar1 ^ 0xff;
  }
  if ((local_6bf & 1) != 0) {
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_298,"url-list");
    peVar4 = entry::operator[](__return_storage_ptr__,local_298);
    plVar13 = entry::list(peVar4);
    local_288 = plVar13;
    sVar9 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_20->url_seeds);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve(plVar13,sVar9);
    local_2a0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&local_20->url_seeds);
    local_2a8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&local_20->url_seeds);
    local_2b0 = (vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)
                ::std::
                back_inserter<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>
                          (local_288);
    local_2b8 = (vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)
                ::std::
                copy<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>>
                          (local_2a0,local_2a8,
                           (back_insert_iterator<std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>_>
                            )local_2b0);
  }
  bVar1 = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&local_20->http_seeds);
  local_6e9 = 0;
  if (!bVar1) {
    local_2c0 = atp_local._4_4_;
    httpseeds_list._4_4_ = 2;
    local_2bc = (uint)libtorrent::flags::operator&
                                (atp_local._4_4_,
                                 (bitfield_flag<unsigned_int,_libtorrent::write_torrent_flags_tag,_void>
                                  )0x2);
    bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_2bc);
    local_6e9 = bVar1 ^ 0xff;
  }
  if ((local_6e9 & 1) != 0) {
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_2e0,"httpseeds");
    peVar4 = entry::operator[](__return_storage_ptr__,local_2e0);
    plVar13 = entry::list(peVar4);
    local_2d0 = plVar13;
    sVar9 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_20->http_seeds);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve(plVar13,sVar9);
    local_2e8._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin(&local_20->http_seeds);
    local_2f0._M_current =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ::std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(&local_20->http_seeds);
    local_2f8 = (vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)
                ::std::
                back_inserter<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>
                          (local_2d0);
    local_300 = (vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)
                ::std::
                copy<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::back_insert_iterator<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>>
                          (local_2e8,local_2f0,
                           (back_insert_iterator<std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>_>
                            )local_2f8);
  }
  bVar1 = ::std::
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::empty(&local_20->dht_nodes);
  local_719 = false;
  if (!bVar1) {
    local_308 = atp_local._4_4_;
    nodes._4_4_ = 4;
    local_304 = (uint)libtorrent::flags::operator&
                                (atp_local._4_4_,
                                 (bitfield_flag<unsigned_int,_libtorrent::write_torrent_flags_tag,_void>
                                  )0x4);
    local_719 = libtorrent::flags::bitfield_flag::operator_cast_to_bool((bitfield_flag *)&local_304)
    ;
  }
  if (local_719 != false) {
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)&__range2_1,"nodes");
    peVar4 = entry::operator[](__return_storage_ptr__,___range2_1);
    pvVar15 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)entry::list(peVar4);
    local_318 = pvVar15;
    sVar9 = ::std::
            vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::size(&local_20->dht_nodes);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)pvVar15,sVar9);
    this_02 = &local_20->dht_nodes;
    __end2_1 = ::std::
               vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::begin(this_02);
    n = (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>
         *)::std::
           vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
           ::end(this_02);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_1,
                              (__normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                               *)&n), bVar1) {
      node.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)__gnu_cxx::
                    __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
                    ::operator*(&__end2_1);
      ::std::allocator<libtorrent::entry>::allocator(&local_361);
      ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::vector
                ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_360,2,
                 &local_361);
      ::std::allocator<libtorrent::entry>::~allocator(&local_361);
      ::std::__cxx11::string::string
                ((string *)&local_388,
                 (string *)
                 node.super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>.
                 _M_impl.super__Vector_impl_data._M_end_of_storage);
      pvVar14 = ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::operator[]
                          ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)
                           local_360,0);
      entry::operator=(pvVar14,&local_388);
      ::std::__cxx11::string::~string((string *)&local_388);
      iVar2 = *(int *)((long)&((node.
                                super__Vector_base<libtorrent::entry,_std::allocator<libtorrent::entry>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage)->
                              super_variant_type).
                              super__Variant_base<long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>,_boost::container::map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_libtorrent::entry,_libtorrent::aux::strview_less,_void,_void>,_std::vector<char,_std::allocator<char>_>,_libtorrent::entry_types::uninitialized_type>
                              .
                              super__Move_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                              .
                              super__Copy_assign_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                              .
                              super__Move_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                              .
                              super__Copy_ctor_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                              .
                              super__Variant_storage_alias<long,_std::__cxx11::basic_string<char>,_std::vector<libtorrent::entry>,_boost::container::map<std::__cxx11::basic_string<char>,_libtorrent::entry,_libtorrent::aux::strview_less>,_std::vector<char>,_libtorrent::entry_types::uninitialized_type>
                      + 0x20);
      pvVar14 = ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::operator[]
                          ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)
                           local_360,1);
      entry::operator=(pvVar14,(long)iVar2);
      ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
      emplace_back<std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>>
                (local_318,
                 (vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_360);
      ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::~vector
                ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)local_360);
      __gnu_cxx::
      __normal_iterator<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_*,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>_>
      ::operator++(&__end2_1);
    }
  }
  peVar3 = ::std::
           __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_20->ti);
  l._7_1_ = 0;
  torrent_info::similar_torrents(&local_3a0,peVar3);
  bVar1 = ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
          empty(&local_3a0);
  local_749 = 0;
  if (!bVar1) {
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_20->ti);
    torrent_info::info(&local_3e0,peVar3,"similar");
    l._7_1_ = 1;
    bVar1 = bdecode_node::operator_cast_to_bool(&local_3e0);
    local_749 = bVar1 ^ 0xff;
  }
  if ((l._7_1_ & 1) != 0) {
    bdecode_node::~bdecode_node(&local_3e0);
  }
  ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::~vector
            (&local_3a0);
  if ((local_749 & 1) != 0) {
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_400,"similar")
    ;
    peVar4 = entry::operator[](__return_storage_ptr__,local_400);
    pvVar15 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)entry::list(peVar4);
    local_3f0 = pvVar15;
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_20->ti);
    torrent_info::similar_torrents
              ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *)
               &__range2_2,peVar3);
    sVar9 = ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
            ::size((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                    *)&__range2_2);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)pvVar15,sVar9);
    ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::~vector
              ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *)
               &__range2_2);
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_20->ti);
    torrent_info::similar_torrents
              ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *)
               &__begin2_2,peVar3);
    __end2_2 = ::std::
               vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
               begin((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>
                      *)&__begin2_2);
    n_1 = (digest32<160L> *)
          ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::
          end((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *)
              &__begin2_2);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_2,
                              (__normal_iterator<libtorrent::digest32<160L>_*,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
                               *)&n_1), bVar1) {
      local_450 = __gnu_cxx::
                  __normal_iterator<libtorrent::digest32<160L>_*,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
                  ::operator*(&__end2_2);
      pvVar15 = local_3f0;
      digest32<160l>::to_string_abi_cxx11_(&local_470,local_450);
      ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
      emplace_back<std::__cxx11::string>(pvVar15,&local_470);
      ::std::__cxx11::string::~string((string *)&local_470);
      __gnu_cxx::
      __normal_iterator<libtorrent::digest32<160L>_*,_std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>_>
      ::operator++(&__end2_2);
    }
    ::std::vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_>::~vector
              ((vector<libtorrent::digest32<160L>,_std::allocator<libtorrent::digest32<160L>_>_> *)
               &__begin2_2);
  }
  peVar3 = ::std::
           __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&local_20->ti);
  l_1._7_1_ = 0;
  torrent_info::collections_abi_cxx11_(&local_488,peVar3);
  bVar1 = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::empty(&local_488);
  local_771 = 0;
  if (!bVar1) {
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_20->ti);
    torrent_info::info(&local_4c8,peVar3,"collections");
    l_1._7_1_ = 1;
    bVar1 = bdecode_node::operator_cast_to_bool(&local_4c8);
    local_771 = bVar1 ^ 0xff;
  }
  if ((l_1._7_1_ & 1) != 0) {
    bdecode_node::~bdecode_node(&local_4c8);
  }
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_488);
  if ((local_771 & 1) != 0) {
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_4e8,"collections");
    peVar4 = entry::operator[](__return_storage_ptr__,local_4e8);
    pvVar15 = (vector<libtorrent::entry,std::allocator<libtorrent::entry>> *)entry::list(peVar4);
    local_4d8 = pvVar15;
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_20->ti);
    torrent_info::collections_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range2_3,peVar3);
    sVar9 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)&__range2_3);
    ::std::vector<libtorrent::entry,_std::allocator<libtorrent::entry>_>::reserve
              ((vector<libtorrent::entry,_std::allocator<libtorrent::entry>_> *)pvVar15,sVar9);
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__range2_3);
    peVar3 = ::std::
             __shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<libtorrent::torrent_info,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)&local_20->ti);
    torrent_info::collections_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__begin2_3,peVar3);
    __end2_3 = ::std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&__begin2_3);
    n_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&__begin2_3);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2_3,
                              (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&n_2), bVar1) {
      local_538 = __gnu_cxx::
                  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2_3);
      ::std::vector<libtorrent::entry,std::allocator<libtorrent::entry>>::
      emplace_back<std::__cxx11::string_const&>(local_4d8,local_538);
      __gnu_cxx::
      __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2_3);
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&__begin2_3);
  }
  sVar9 = ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&local_20->trackers);
  if (sVar9 == 1) {
    pvVar16 = ::std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::front(&local_20->trackers);
    ::std::__cxx11::string::string((string *)&local_558,(string *)pvVar16);
    ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_568,"announce");
    peVar4 = entry::operator[](__return_storage_ptr__,local_568);
    entry::operator=(peVar4,&local_558);
    ::std::__cxx11::string::~string((string *)&local_558);
  }
  else {
    sVar9 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size(&local_20->trackers);
    if (1 < sVar9) {
      anon_unknown_24::build_tracker_list(&local_590,&local_20->trackers,&local_20->tracker_tiers);
      ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_5a0,"announce-list");
      peVar4 = entry::operator[](__return_storage_ptr__,local_5a0);
      entry::operator=(peVar4,&local_590);
      entry::~entry(&local_590);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

entry write_torrent_file(add_torrent_params const& atp, write_torrent_flags_t const flags)
	{
		entry ret;
		if (!atp.ti)
			aux::throw_ex<system_error>(errors::torrent_missing_info);

		auto const info = atp.ti->info_section();
		ret["info"].preformatted().assign(info.data(), info.data() + info.size());

		if (!atp.comment.empty())
			ret["comment"] = atp.comment;
		if (atp.creation_date != 0)
			ret["creation date"] = atp.creation_date;
		if (!atp.created_by.empty())
			ret["created by"] = atp.created_by;

		if (!atp.merkle_trees.empty())
		{
			file_storage const& fs = atp.ti->files();
			auto& trees = atp.merkle_trees;
			if (int(trees.size()) != fs.num_files())
				aux::throw_ex<system_error>(errors::torrent_missing_piece_layer);

			auto& piece_layers = ret["piece layers"].dict();
			bitfield const empty_verified;
			for (file_index_t f : fs.file_range())
			{
				if (fs.pad_file_at(f) || fs.file_size(f) <= fs.piece_length())
					continue;

				aux::merkle_tree t(fs.file_num_blocks(f), fs.blocks_per_piece(), fs.root_ptr(f));

				bitfield const& verified = (f >= atp.verified_leaf_hashes.end_index())
					? empty_verified : atp.verified_leaf_hashes[f];

				auto const& tree = trees[f];
				if (f < atp.merkle_tree_mask.end_index() && !atp.merkle_tree_mask[f].empty())
				{
					t.load_sparse_tree(tree, atp.merkle_tree_mask[f], verified);
				}
				else
				{
					t.load_tree(tree, verified);
				}

				auto const piece_layer = t.get_piece_layer();
				if (int(piece_layer.size()) != fs.file_num_pieces(f))
					aux::throw_ex<system_error>(errors::torrent_invalid_piece_layer);

				auto& layer = piece_layers[t.root().to_string()].string();

				for (auto const& h : piece_layer)
					layer += h.to_string();
			}
		}
		else if (atp.ti->v2() && !(flags & write_flags::allow_missing_piece_layer))
		{
			// we must have piece layers for v2 torrents for them to be valid
			// .torrent files
			aux::throw_ex<system_error>(errors::torrent_missing_piece_layer);
		}

		// save web seeds
		if (!atp.url_seeds.empty() && !(flags & write_flags::no_http_seeds))
		{
			auto& url_list = ret["url-list"].list();
			url_list.reserve(atp.url_seeds.size());
			std::copy(atp.url_seeds.begin(), atp.url_seeds.end(), std::back_inserter(url_list));
		}

#if TORRENT_ABI_VERSION < 4
		if (!atp.http_seeds.empty() && !(flags & write_flags::no_http_seeds))
		{
			auto& httpseeds_list = ret["httpseeds"].list();
			httpseeds_list.reserve(atp.http_seeds.size());
			std::copy(atp.http_seeds.begin(), atp.http_seeds.end(), std::back_inserter(httpseeds_list));
		}
#endif

		// save DHT nodes
		if (!atp.dht_nodes.empty() && (flags & write_flags::include_dht_nodes))
		{
			auto& nodes = ret["nodes"].list();
			nodes.reserve(atp.dht_nodes.size());
			for (auto const& n : atp.dht_nodes)
			{
				entry::list_type node(2);
				node[0] = std::move(n.first);
				node[1] = n.second;
				nodes.emplace_back(std::move(node));
			}
		}

		if (!atp.ti->similar_torrents().empty() && !atp.ti->info("similar"))
		{
			auto& l = ret["similar"].list();
			l.reserve(atp.ti->similar_torrents().size());
			for (auto const& n : atp.ti->similar_torrents())
				l.emplace_back(n.to_string());
		}

		if (!atp.ti->collections().empty() && !atp.ti->info("collections"))
		{
			auto& l = ret["collections"].list();
			l.reserve(atp.ti->collections().size());
			for (auto const& n : atp.ti->collections())
				l.emplace_back(n);
		}

		// save trackers
		if (atp.trackers.size() == 1)
			ret["announce"] = atp.trackers.front();
		else if (atp.trackers.size() > 1)
			ret["announce-list"] = build_tracker_list(atp.trackers, atp.tracker_tiers);

		return ret;
	}